

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

cmFileLockResult __thiscall
cmFileLockPool::ScopePool::Lock(ScopePool *this,string *filename,unsigned_long timeoutSec)

{
  bool bVar1;
  cmFileLock *pcVar2;
  cmFileLockResult local_44;
  cmFileLockResult result;
  cmFileLock *local_30;
  cmFileLock *lock;
  unsigned_long timeoutSec_local;
  string *filename_local;
  ScopePool *this_local;
  
  lock = (cmFileLock *)timeoutSec;
  timeoutSec_local = (unsigned_long)filename;
  filename_local = (string *)this;
  pcVar2 = (cmFileLock *)operator_new(0x28);
  cmFileLock::cmFileLock(pcVar2);
  local_30 = pcVar2;
  local_44 = cmFileLock::Lock(pcVar2,(string *)timeoutSec_local,(unsigned_long)lock);
  bVar1 = cmFileLockResult::IsOk(&local_44);
  pcVar2 = local_30;
  if (bVar1) {
    std::__cxx11::list<cmFileLock_*,_std::allocator<cmFileLock_*>_>::push_back
              (&this->Locks,&local_30);
    this_local = (ScopePool *)cmFileLockResult::MakeOk();
  }
  else {
    if (local_30 != (cmFileLock *)0x0) {
      cmFileLock::~cmFileLock(local_30);
      operator_delete(pcVar2,0x28);
    }
    this_local = (ScopePool *)local_44;
  }
  return (cmFileLockResult)this_local;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Lock(
    const std::string& filename, unsigned long timeoutSec)
{
  cmFileLock *lock = new cmFileLock();
  const cmFileLockResult result = lock->Lock(filename, timeoutSec);
  if (result.IsOk())
    {
    this->Locks.push_back(lock);
    return cmFileLockResult::MakeOk();
    }
  else
    {
    delete lock;
    return result;
    }
}